

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O3

pair<int,_int> __thiscall
chrono::geometry::ChTriangleMeshConnected::GetTriangleEdgeIndexes
          (ChTriangleMeshConnected *this,ChVector<int> *face_indices,int nedge,bool unique)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pair<int,_int> pVar4;
  ulong uVar5;
  
  if (2 < (uint)nedge) {
    __assert_fail("index < 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/core/ChVector.h"
                  ,0x1f6,
                  "const Real &chrono::ChVector<int>::operator[](unsigned int) const [Real = int]");
  }
  uVar5 = 0;
  iVar1 = face_indices->m_data[(uint)nedge];
  if (nedge != 2) {
    uVar5 = (ulong)(nedge + 1);
  }
  iVar2 = face_indices->m_data[uVar5];
  iVar3 = iVar2;
  if (unique && iVar2 < iVar1) {
    iVar3 = iVar1;
    iVar1 = iVar2;
  }
  pVar4.second = iVar3;
  pVar4.first = iVar1;
  return pVar4;
}

Assistant:

inline const Real& ChVector<Real>::operator[](unsigned index) const {
    assert(index < 3);
    return m_data[index];
}